

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_resolver.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnBindingResolver::VisitOperator(ColumnBindingResolver *this,LogicalOperator *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  LogicalOperatorType LVar1;
  pointer pLVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer puVar3;
  pointer puVar4;
  char cVar5;
  reference pvVar6;
  type pLVar7;
  LogicalInsert *pLVar8;
  ColumnList *pCVar9;
  LogicalExtensionOperator *pLVar10;
  LogicalAnyJoin *pLVar11;
  pointer pLVar12;
  InternalException *this_01;
  LogicalRecursiveCTE *pLVar13;
  LogicalCreateIndex *pLVar14;
  pointer pCVar15;
  JoinCondition *cond;
  pointer puVar16;
  pointer pLVar17;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_2;
  pointer puVar18;
  JoinCondition *cond_1;
  vector<duckdb::ColumnBinding,_true> dummy_bindings;
  string local_68;
  pointer local_48;
  pointer pCStack_40;
  pointer local_38;
  
  LVar1 = op->type;
  if (LVar1 < LOGICAL_RECURSIVE_CTE) {
    switch(LVar1) {
    case LOGICAL_DELIM_JOIN:
      this_00 = &op->children;
      if (*(char *)&op[2].expressions.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](this_00,1);
        unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
        operator*(pvVar6);
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this);
        pLVar2 = (pointer)op[1].estimated_cardinality;
        for (pLVar17 = op[1].types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; pLVar17 != pLVar2;
            pLVar17 = pLVar17 + 1) {
          (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this);
        }
      }
      else {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](this_00,0);
        unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
        operator*(pvVar6);
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this);
        pLVar2 = (pointer)op[1].estimated_cardinality;
        for (pLVar17 = op[1].types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; pLVar17 != pLVar2;
            pLVar17 = pLVar17 + 1) {
          (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this);
        }
      }
      puVar3 = op[2].children.
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      for (puVar16 = op[2].children.
                     super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; puVar16 != puVar3;
          puVar16 = puVar16 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this);
      }
      if (*(char *)&op[2].expressions.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == '\0') {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](this_00,1);
        pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(pvVar6);
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar7);
        pLVar2 = (pointer)op[1].estimated_cardinality;
        for (pLVar17 = op[1].types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; pLVar17 != pLVar2;
            pLVar17 = pLVar17 + 1) {
          (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
                    (this,&pLVar17->type_info_);
        }
      }
      else {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](this_00,0);
        pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(pvVar6);
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar7);
        pLVar2 = (pointer)op[1].estimated_cardinality;
        for (pLVar17 = op[1].types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; pLVar17 != pLVar2;
            pLVar17 = pLVar17 + 1) {
          (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,pLVar17);
        }
      }
      break;
    case LOGICAL_COMPARISON_JOIN:
    case LOGICAL_ASOF_JOIN:
      pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar6);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar7);
      pLVar2 = (pointer)op[1].estimated_cardinality;
      for (pLVar17 = op[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar17 != pLVar2;
          pLVar17 = pLVar17 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,pLVar17);
      }
      if (op[2].types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,&op[2].types);
      }
      puVar3 = op[2].children.
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      for (puVar16 = op[2].children.
                     super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; puVar16 != puVar3;
          puVar16 = puVar16 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,puVar16);
      }
      pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,1);
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar6);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar7);
      pLVar2 = (pointer)op[1].estimated_cardinality;
      for (pLVar17 = op[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar17 != pLVar2;
          pLVar17 = pLVar17 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
                  (this,&pLVar17->type_info_);
      }
      break;
    case LOGICAL_ANY_JOIN:
      LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
      (*op->_vptr_LogicalOperator[2])(&local_68,op);
      pCVar15 = (this->bindings).
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
      (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
      (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      if ((pCVar15 != (pointer)0x0) &&
         (operator_delete(pCVar15), local_68._M_dataplus._M_p != (pointer)0x0)) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pLVar11 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(op);
      cVar5 = (pLVar11->super_LogicalJoin).super_LogicalOperator.field_0x61;
      if ((byte)(cVar5 - 5U) < 2) {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](&op->children,1);
        pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->(pvVar6);
        (*pLVar12->_vptr_LogicalOperator[2])(&local_68,pLVar12);
        ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>>
                  ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                   &this->bindings,
                   (this->bindings).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_68._M_dataplus._M_p,
                   local_68._M_string_length);
        if (local_68._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        cVar5 = (pLVar11->super_LogicalJoin).super_LogicalOperator.field_0x61;
      }
      if ((byte)(cVar5 - 9U) < 2) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"RIGHT SEMI/ANTI any join not supported yet","");
        InternalException::InternalException(this_01,&local_68);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_015c0ab3;
    default:
      if (LVar1 == LOGICAL_GET) {
        (*op->_vptr_LogicalOperator[2])(&local_68,op);
LAB_015c0a78:
        pCVar15 = (this->bindings).
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
        .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
        (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
        .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
        (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
        .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        local_68.field_2._M_allocated_capacity = 0;
        if ((pCVar15 != (pointer)0x0) &&
           (operator_delete(pCVar15), local_68._M_dataplus._M_p != (pointer)0x0)) {
          operator_delete(local_68._M_dataplus._M_p);
        }
LAB_015c0ab3:
        LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
        return;
      }
    case LOGICAL_CROSS_PRODUCT:
    case LOGICAL_POSITIONAL_JOIN:
switchD_015c0591_caseD_36:
      LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
    }
    (*op->_vptr_LogicalOperator[2])(&local_68,op);
    pCVar15 = (this->bindings).
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
    (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
    (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    if (pCVar15 != (pointer)0x0) {
LAB_015c0824:
      operator_delete(pCVar15);
LAB_015c0829:
      if ((pointer)local_68._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    return;
  }
  if (LOGICAL_CREATE_TABLE < LVar1) {
    if (LVar1 == LOGICAL_CREATE_INDEX) {
      pLVar14 = LogicalOperator::Cast<duckdb::LogicalCreateIndex>(op);
      pCVar9 = TableCatalogEntry::GetColumns(pLVar14->table);
      LogicalOperator::GenerateColumnBindings
                ((vector<duckdb::ColumnBinding,_true> *)&local_68,0,
                 ((long)(pCVar9->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar9->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      goto LAB_015c0a78;
    }
    if (LVar1 == LOGICAL_EXTENSION_OPERATOR) {
      pLVar10 = LogicalOperator::Cast<duckdb::LogicalExtensionOperator>(op);
      UNRECOVERED_JUMPTABLE = (pLVar10->super_LogicalOperator)._vptr_LogicalOperator[0x10];
      (*UNRECOVERED_JUMPTABLE)(pLVar10,this,&this->bindings,UNRECOVERED_JUMPTABLE);
      return;
    }
    goto switchD_015c0591_caseD_36;
  }
  if (LVar1 == LOGICAL_RECURSIVE_CTE) {
    pLVar13 = LogicalOperator::Cast<duckdb::LogicalRecursiveCTE>(op);
    LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
    (*op->_vptr_LogicalOperator[2])(&local_68,op);
    pCVar15 = (this->bindings).
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
    (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
    (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    if ((pCVar15 != (pointer)0x0) &&
       (operator_delete(pCVar15), local_68._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    puVar4 = (pLVar13->key_targets).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar18 = (pLVar13->key_targets).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar4;
        puVar18 = puVar18 + 1) {
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,puVar18);
    }
    return;
  }
  if ((LVar1 != LOGICAL_INSERT) ||
     (pLVar8 = LogicalOperator::Cast<duckdb::LogicalInsert>(op), pLVar8->action_type == THROW))
  goto switchD_015c0591_caseD_36;
  LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
  pCVar9 = TableCatalogEntry::GetColumns(pLVar8->table);
  LogicalOperator::GenerateColumnBindings
            ((vector<duckdb::ColumnBinding,_true> *)&local_68,pLVar8->excluded_table_index,
             (long)(pCVar9->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar9->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>>
            ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)&this->bindings,
             (this->bindings).
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_start,local_68._M_dataplus._M_p,
             local_68._M_string_length);
  if ((pLVar8->on_conflict_condition).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
              (this,&pLVar8->on_conflict_condition);
  }
  if ((pLVar8->do_update_condition).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
              (this,&pLVar8->do_update_condition);
  }
  LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  (*op->_vptr_LogicalOperator[2])(&local_48,op);
  pCVar15 = (this->bindings).
            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = local_48;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = pCStack_40;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  pCStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if ((pCVar15 != (pointer)0x0) &&
     (operator_delete(pCVar15), pCVar15 = local_48, local_48 != (pointer)0x0)) goto LAB_015c0824;
  goto LAB_015c0829;
}

Assistant:

void ColumnBindingResolver::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		// special case: comparison join
		auto &comp_join = op.Cast<LogicalComparisonJoin>();
		// first get the bindings of the LHS and resolve the LHS expressions
		VisitOperator(*comp_join.children[0]);
		for (auto &cond : comp_join.conditions) {
			VisitExpression(&cond.left);
		}
		// resolve any single-side predicates
		// for now, only ASOF supports this, and we are guaranteed that all right side predicates
		// have been pushed into a filter.
		if (comp_join.predicate) {
			D_ASSERT(op.type == LogicalOperatorType::LOGICAL_ASOF_JOIN);
			VisitExpression(&comp_join.predicate);
		}
		// visit the duplicate eliminated columns on the LHS, if any
		for (auto &expr : comp_join.duplicate_eliminated_columns) {
			VisitExpression(&expr);
		}
		// then get the bindings of the RHS and resolve the RHS expressions
		VisitOperator(*comp_join.children[1]);
		for (auto &cond : comp_join.conditions) {
			VisitExpression(&cond.right);
		}
		// finally update the bindings with the result bindings of the join
		bindings = op.GetColumnBindings();
		return;
	}
	case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
		auto &comp_join = op.Cast<LogicalComparisonJoin>();
		// depending on whether the delim join has been flipped, get the appropriate bindings
		if (comp_join.delim_flipped) {
			VisitOperator(*comp_join.children[1]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.right);
			}
		} else {
			VisitOperator(*comp_join.children[0]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.left);
			}
		}
		// visit the duplicate eliminated columns
		for (auto &expr : comp_join.duplicate_eliminated_columns) {
			VisitExpression(&expr);
		}
		// now get the other side
		if (comp_join.delim_flipped) {
			VisitOperator(*comp_join.children[0]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.left);
			}
		} else {
			VisitOperator(*comp_join.children[1]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.right);
			}
		}
		// finally update the bindings with the result bindings of the join
		bindings = op.GetColumnBindings();
		return;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		// ANY join, this join is different because we evaluate the expression on the bindings of BOTH join sides at
		// once i.e. we set the bindings first to the bindings of the entire join, and then resolve the expressions of
		// this operator
		VisitOperatorChildren(op);
		bindings = op.GetColumnBindings();
		auto &any_join = op.Cast<LogicalAnyJoin>();
		if (any_join.join_type == JoinType::SEMI || any_join.join_type == JoinType::ANTI) {
			auto right_bindings = op.children[1]->GetColumnBindings();
			bindings.insert(bindings.end(), right_bindings.begin(), right_bindings.end());
		}
		if (any_join.join_type == JoinType::RIGHT_SEMI || any_join.join_type == JoinType::RIGHT_ANTI) {
			throw InternalException("RIGHT SEMI/ANTI any join not supported yet");
		}
		VisitOperatorExpressions(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_CREATE_INDEX: {
		// CREATE INDEX statement, add the columns of the table with table index 0 to the binding set
		// afterwards bind the expressions of the CREATE INDEX statement
		auto &create_index = op.Cast<LogicalCreateIndex>();
		bindings = LogicalOperator::GenerateColumnBindings(0, create_index.table.GetColumns().LogicalColumnCount());
		VisitOperatorExpressions(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_GET: {
		//! We first need to update the current set of bindings and then visit operator expressions
		bindings = op.GetColumnBindings();
		VisitOperatorExpressions(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_INSERT: {
		//! We want to execute the normal path, but also add a dummy 'excluded' binding if there is a
		// ON CONFLICT DO UPDATE clause
		auto &insert_op = op.Cast<LogicalInsert>();
		if (insert_op.action_type != OnConflictAction::THROW) {
			// Get the bindings from the children
			VisitOperatorChildren(op);
			auto column_count = insert_op.table.GetColumns().PhysicalColumnCount();
			auto dummy_bindings = LogicalOperator::GenerateColumnBindings(insert_op.excluded_table_index, column_count);
			// Now insert our dummy bindings at the start of the bindings,
			// so the first 'column_count' indices of the chunk are reserved for our 'excluded' columns
			bindings.insert(bindings.begin(), dummy_bindings.begin(), dummy_bindings.end());
			if (insert_op.on_conflict_condition) {
				VisitExpression(&insert_op.on_conflict_condition);
			}
			if (insert_op.do_update_condition) {
				VisitExpression(&insert_op.do_update_condition);
			}
			VisitOperatorExpressions(op);
			bindings = op.GetColumnBindings();
			return;
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR: {
		auto &ext_op = op.Cast<LogicalExtensionOperator>();
		ext_op.ResolveColumnBindings(*this, bindings);
		return;
	}
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE: {
		auto &rec = op.Cast<LogicalRecursiveCTE>();
		VisitOperatorChildren(op);
		bindings = op.GetColumnBindings();

		for (auto &expr : rec.key_targets) {
			VisitExpression(&expr);
		}
		return;
	}
	default:
		break;
	}

	// general case
	// first visit the children of this operator
	VisitOperatorChildren(op);
	// now visit the expressions of this operator to resolve any bound column references
	VisitOperatorExpressions(op);
	// finally update the current set of bindings to the current set of column bindings
	bindings = op.GetColumnBindings();
}